

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O3

char * read_string(scanner_t *s,va_list *ap,char *purpose,size_t *out_len,int *ours,int optional)

{
  token_t *ptVar1;
  token_t *ptVar2;
  token_t *ptVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined7 uVar8;
  int iVar9;
  undefined8 *puVar10;
  int *piVar11;
  size_t *psVar12;
  size_t length;
  char *pcVar13;
  json_error_code code;
  size_t sVar14;
  strbuffer_t strbuff;
  strbuffer_t local_58;
  int *local_40;
  size_t *local_38;
  
  next_token(s);
  bVar4 = (s->token).token;
  iVar9 = (s->token).column;
  sVar14 = (s->token).pos;
  (s->next_token).line = (s->token).line;
  (s->next_token).column = iVar9;
  (s->next_token).pos = sVar14;
  uVar8 = *(undefined7 *)&(s->token).field_0x11;
  (s->next_token).token = (s->token).token;
  *(undefined7 *)&(s->next_token).field_0x11 = uVar8;
  iVar9 = (s->prev_token).column;
  sVar14 = (s->prev_token).pos;
  uVar7 = *(undefined4 *)((long)&(s->prev_token).pos + 4);
  (s->token).line = (s->prev_token).line;
  (s->token).column = iVar9;
  *(int *)&(s->token).pos = (int)sVar14;
  *(undefined4 *)((long)&(s->token).pos + 4) = uVar7;
  uVar8 = *(undefined7 *)&(s->prev_token).field_0x11;
  (s->token).token = (s->prev_token).token;
  *(undefined7 *)&(s->token).field_0x11 = uVar8;
  *ours = 0;
  if (((ulong)bVar4 < 0x2c) && ((0x82800000000U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
    if (optional == 0) {
      local_40 = ours;
      local_38 = out_len;
      iVar9 = strbuffer_init(&local_58);
      if (iVar9 != 0) {
        set_error(s,"<internal>",json_error_out_of_memory,"Out of memory");
        s->has_error = 1;
      }
      ptVar1 = &s->next_token;
      ptVar2 = &s->token;
      ptVar3 = &s->prev_token;
      do {
        uVar6 = (*ap)[0].gp_offset;
        if ((ulong)uVar6 < 0x29) {
          puVar10 = (undefined8 *)((ulong)uVar6 + (long)(*ap)[0].reg_save_area);
          (*ap)[0].gp_offset = uVar6 + 8;
        }
        else {
          puVar10 = (undefined8 *)(*ap)[0].overflow_arg_area;
          (*ap)[0].overflow_arg_area = puVar10 + 1;
        }
        pcVar13 = (char *)*puVar10;
        if (pcVar13 == (char *)0x0) {
          set_error(s,"<args>",json_error_null_value,"NULL %s",purpose);
          s->has_error = 1;
        }
        next_token(s);
        cVar5 = (s->token).token;
        if (cVar5 == '%') {
          uVar6 = (*ap)[0].gp_offset;
          if ((ulong)uVar6 < 0x29) {
            psVar12 = (size_t *)((ulong)uVar6 + (long)(*ap)[0].reg_save_area);
            (*ap)[0].gp_offset = uVar6 + 8;
          }
          else {
            psVar12 = (size_t *)(*ap)[0].overflow_arg_area;
            (*ap)[0].overflow_arg_area = psVar12 + 1;
          }
          sVar14 = *psVar12;
LAB_0011772f:
          if (s->has_error == 0) {
LAB_00117735:
            iVar9 = strbuffer_append_bytes(&local_58,pcVar13,sVar14);
            if (iVar9 == -1) {
              set_error(s,"<internal>",json_error_out_of_memory,"Out of memory");
              s->has_error = 1;
            }
          }
        }
        else {
          if (cVar5 == '#') {
            uVar6 = (*ap)[0].gp_offset;
            if ((ulong)uVar6 < 0x29) {
              piVar11 = (int *)((ulong)uVar6 + (long)(*ap)[0].reg_save_area);
              (*ap)[0].gp_offset = uVar6 + 8;
            }
            else {
              piVar11 = (int *)(*ap)[0].overflow_arg_area;
              (*ap)[0].overflow_arg_area = piVar11 + 2;
            }
            sVar14 = (size_t)*piVar11;
            goto LAB_0011772f;
          }
          uVar8 = *(undefined7 *)&(s->token).field_0x11;
          (s->next_token).token = (s->token).token;
          *(undefined7 *)&(s->next_token).field_0x11 = uVar8;
          iVar9 = ptVar2->column;
          sVar14 = (s->token).pos;
          ptVar1->line = ptVar2->line;
          ptVar1->column = iVar9;
          (s->next_token).pos = sVar14;
          uVar8 = *(undefined7 *)&(s->prev_token).field_0x11;
          (s->token).token = (s->prev_token).token;
          *(undefined7 *)&(s->token).field_0x11 = uVar8;
          iVar9 = ptVar3->column;
          sVar14 = (s->prev_token).pos;
          ptVar2->line = ptVar3->line;
          ptVar2->column = iVar9;
          (s->token).pos = sVar14;
          if (s->has_error == 0) {
            sVar14 = strlen(pcVar13);
            goto LAB_00117735;
          }
        }
        next_token(s);
      } while ((s->token).token == '+');
      uVar8 = *(undefined7 *)&(s->token).field_0x11;
      (s->next_token).token = (s->token).token;
      *(undefined7 *)&(s->next_token).field_0x11 = uVar8;
      iVar9 = ptVar2->column;
      sVar14 = (s->token).pos;
      ptVar1->line = ptVar2->line;
      ptVar1->column = iVar9;
      (s->next_token).pos = sVar14;
      uVar8 = *(undefined7 *)&(s->prev_token).field_0x11;
      (s->token).token = (s->prev_token).token;
      *(undefined7 *)&(s->token).field_0x11 = uVar8;
      iVar9 = ptVar3->column;
      sVar14 = (s->prev_token).pos;
      ptVar2->line = ptVar3->line;
      ptVar2->column = iVar9;
      (s->token).pos = sVar14;
      if (s->has_error != 0) {
        strbuffer_close(&local_58);
        return (char *)0x0;
      }
      iVar9 = utf8_check_string(local_58.value,local_58.length);
      if (iVar9 != 0) {
        *local_38 = local_58.length;
        *local_40 = 1;
        pcVar13 = strbuffer_steal_value(&local_58);
        return pcVar13;
      }
      set_error(s,"<args>",json_error_invalid_utf8,"Invalid UTF-8 %s",purpose);
      strbuffer_close(&local_58);
    }
    else {
      set_error(s,"<format>",json_error_invalid_format,"Cannot use \'%c\' on optional strings",
                (ulong)(uint)(int)(char)bVar4);
    }
  }
  else {
    uVar6 = (*ap)[0].gp_offset;
    if ((ulong)uVar6 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar6 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].gp_offset = uVar6 + 8;
    }
    else {
      puVar10 = (undefined8 *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = puVar10 + 1;
    }
    pcVar13 = (char *)*puVar10;
    if (pcVar13 == (char *)0x0) {
      if (optional != 0) {
        return (char *)0x0;
      }
      pcVar13 = "NULL %s";
      code = json_error_null_value;
    }
    else {
      length = strlen(pcVar13);
      iVar9 = utf8_check_string(pcVar13,length);
      if (iVar9 != 0) {
        *out_len = length;
        return pcVar13;
      }
      pcVar13 = "Invalid UTF-8 %s";
      code = json_error_invalid_utf8;
    }
    set_error(s,"<args>",code,pcVar13,purpose);
  }
  s->has_error = 1;
  return (char *)0x0;
}

Assistant:

static char *read_string(scanner_t *s, va_list *ap, const char *purpose, size_t *out_len,
                         int *ours, int optional) {
    char t;
    strbuffer_t strbuff;
    const char *str;
    size_t length;

    next_token(s);
    t = token(s);
    prev_token(s);

    *ours = 0;
    if (t != '#' && t != '%' && t != '+') {
        /* Optimize the simple case */
        str = va_arg(*ap, const char *);

        if (!str) {
            if (!optional) {
                set_error(s, "<args>", json_error_null_value, "NULL %s", purpose);
                s->has_error = 1;
            }
            return NULL;
        }

        length = strlen(str);

        if (!utf8_check_string(str, length)) {
            set_error(s, "<args>", json_error_invalid_utf8, "Invalid UTF-8 %s", purpose);
            s->has_error = 1;
            return NULL;
        }

        *out_len = length;
        return (char *) str;
    } else if (optional) {
        set_error(s, "<format>", json_error_invalid_format,
                  "Cannot use '%c' on optional strings", t);
        s->has_error = 1;

        return NULL;
    }

    if (strbuffer_init(&strbuff)) {
        set_error(s, "<internal>", json_error_out_of_memory, "Out of memory");
        s->has_error = 1;
    }

    while (1) {
        str = va_arg(*ap, const char *);
        if (!str) {
            set_error(s, "<args>", json_error_null_value, "NULL %s", purpose);
            s->has_error = 1;
        }

        next_token(s);

        if (token(s) == '#') {
            length = va_arg(*ap, int);
        } else if (token(s) == '%') {
            length = va_arg(*ap, size_t);
        } else {
            prev_token(s);
            length = s->has_error ? 0 : strlen(str);
        }

        if (!s->has_error && strbuffer_append_bytes(&strbuff, str, length) == -1) {
            set_error(s, "<internal>", json_error_out_of_memory, "Out of memory");
            s->has_error = 1;
        }

        next_token(s);
        if (token(s) != '+') {
            prev_token(s);
            break;
        }
    }

    if (s->has_error) {
        strbuffer_close(&strbuff);
        return NULL;
    }

    if (!utf8_check_string(strbuff.value, strbuff.length)) {
        set_error(s, "<args>", json_error_invalid_utf8, "Invalid UTF-8 %s", purpose);
        strbuffer_close(&strbuff);
        s->has_error = 1;
        return NULL;
    }

    *out_len = strbuff.length;
    *ours = 1;
    return strbuffer_steal_value(&strbuff);
}